

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbClose(sqlite3_file *pFile)

{
  sqlite3_io_methods *p;
  bool bVar1;
  void *p_00;
  sqlite3_mutex *psVar2;
  long lVar3;
  _func_void_sqlite3_mutex_ptr **pp_Var4;
  int iVar5;
  long lVar6;
  
  p = pFile[1].pMethods;
  if (p->xUnlock == (_func_int_sqlite3_file_ptr_int *)0x0) {
    psVar2 = (sqlite3_mutex *)p->xTruncate;
    if (psVar2 == (sqlite3_mutex *)0x0) goto LAB_00128d65;
    pp_Var4 = &sqlite3Config.mutex.xMutexEnter;
  }
  else {
    bVar1 = true;
    if ((sqlite3Config.bCoreMutex == '\0') ||
       (psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), psVar2 == (sqlite3_mutex *)0x0)) {
      psVar2 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
      bVar1 = false;
    }
    if (0 < (long)memdb_g_0) {
      lVar6 = 0;
      do {
        if (*(sqlite3_io_methods **)((long)memdb_g_1 + lVar6 * 8) == p) {
          if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)p->xTruncate);
          }
          p_00 = memdb_g_1;
          if (*(int *)&p->xLock == 1) {
            lVar3 = (long)memdb_g_0;
            iVar5 = memdb_g_0 + -1;
            memdb_g_0 = iVar5;
            *(undefined8 *)((long)memdb_g_1 + lVar6 * 8) =
                 *(undefined8 *)((long)memdb_g_1 + lVar3 * 8 + -8);
            if (iVar5 == 0) {
              sqlite3_free(p_00);
              memdb_g_1 = (void *)0x0;
            }
          }
          break;
        }
        lVar6 = lVar6 + 1;
      } while (memdb_g_0 != lVar6);
    }
    if (bVar1) goto LAB_00128d65;
    pp_Var4 = &sqlite3Config.mutex.xMutexLeave;
  }
  (**pp_Var4)(psVar2);
LAB_00128d65:
  iVar5 = *(int *)&p->xLock;
  *(int *)&p->xLock = iVar5 + -1;
  if (iVar5 < 2) {
    if (((ulong)p->xSync & 0x100000000) != 0) {
      sqlite3_free(p->xWrite);
    }
    if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)p->xTruncate);
      if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)((sqlite3_mutex *)p->xTruncate);
      }
    }
    sqlite3_free(p);
  }
  else if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)p->xTruncate);
  }
  return 0;
}

Assistant:

static int memdbClose(sqlite3_file *pFile){
  MemStore *p = ((MemFile*)pFile)->pStore;
  if( p->zFName ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; ALWAYS(i<memdb_g.nMemStore); i++){
      if( memdb_g.apMemStore[i]==p ){
        memdbEnter(p);
        if( p->nRef==1 ){
          memdb_g.apMemStore[i] = memdb_g.apMemStore[--memdb_g.nMemStore];
          if( memdb_g.nMemStore==0 ){
            sqlite3_free(memdb_g.apMemStore);
            memdb_g.apMemStore = 0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    memdbEnter(p);
  }
  p->nRef--;
  if( p->nRef<=0 ){
    if( p->mFlags & SQLITE_DESERIALIZE_FREEONCLOSE ){
      sqlite3_free(p->aData);
    }
    memdbLeave(p);
    sqlite3_mutex_free(p->pMutex);
    sqlite3_free(p);
  }else{
    memdbLeave(p);
  }
  return SQLITE_OK;
}